

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# movDemuxer.cpp
# Opt level: O3

int __thiscall MovParsedH264TrackData::getNalSize(MovParsedH264TrackData *this,uint8_t *buff)

{
  uint uVar1;
  undefined4 *puVar2;
  ostringstream ss;
  uint8_t local_1b1;
  uint *local_1b0;
  undefined8 local_1a8;
  uint local_1a0;
  undefined4 uStack_19c;
  undefined4 uStack_198;
  undefined4 uStack_194;
  ostringstream local_190 [376];
  
  switch(this->nal_length_size) {
  case '\x01':
    uVar1 = (uint)*buff;
    break;
  case '\x02':
    uVar1 = (uint)(ushort)(*(ushort *)buff << 8 | *(ushort *)buff >> 8);
    break;
  case '\x03':
    uVar1 = (uint)buff[2] | (uint)buff[1] << 8 | (uint)*buff << 0x10;
    break;
  case '\x04':
    uVar1 = *(uint *)buff;
    uVar1 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    break;
  default:
    std::__cxx11::ostringstream::ostringstream(local_190);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,"MP4/MOV error: Unsupported H.264/AVC frame length field value "
               ,0x3e);
    local_1b1 = this->nal_length_size;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,(char *)&local_1b1,1);
    puVar2 = (undefined4 *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    *puVar2 = 0x3b6;
    *(undefined4 **)(puVar2 + 2) = puVar2 + 6;
    if (local_1b0 == &local_1a0) {
      puVar2[6] = local_1a0;
      puVar2[7] = uStack_19c;
      puVar2[8] = uStack_198;
      puVar2[9] = uStack_194;
    }
    else {
      *(uint **)(puVar2 + 2) = local_1b0;
      *(ulong *)(puVar2 + 6) = CONCAT44(uStack_19c,local_1a0);
    }
    *(undefined8 *)(puVar2 + 4) = local_1a8;
    local_1a8 = 0;
    local_1a0 = local_1a0 & 0xffffff00;
    local_1b0 = &local_1a0;
    __cxa_throw(puVar2,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
  }
  return uVar1;
}

Assistant:

int getNalSize(const uint8_t* buff) const
    {
        if (nal_length_size == 1)
            return buff[0];
        if (nal_length_size == 2)
            return (buff[0] << 8) + buff[1];
        if (nal_length_size == 3)
            return (buff[0] << 16) + (buff[1] << 8) + buff[2];
        if (nal_length_size == 4)
            return (buff[0] << 24) + (buff[1] << 16) + (buff[2] << 8) + buff[3];

        THROW(ERR_MOV_PARSE, "MP4/MOV error: Unsupported H.264/AVC frame length field value " << nal_length_size)
    }